

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::while_statement::~while_statement(while_statement *this)

{
  while_statement *this_local;
  
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__while_statement_0029a620;
  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr(&this->s_);
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr(&this->cond_)
  ;
  statement::~statement(&this->super_statement);
  return;
}

Assistant:

explicit while_statement(const source_extend& extend, expression_ptr&& cond, statement_ptr&& s) : statement(extend), cond_(std::move(cond)), s_(std::move(s)) {
        assert(cond_);
        assert(s_);
    }